

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

void __thiscall
MemoryLeakOutputStringBuffer::stopMemoryLeakReporting(MemoryLeakOutputStringBuffer *this)

{
  SimpleStringBuffer *this_00;
  ulong uVar1;
  size_t sVar2;
  char *format;
  
  sVar2 = this->total_leaks_;
  this_00 = &this->outputBuffer_;
  if (sVar2 == 0) {
    format = "No memory leaks were detected.";
  }
  else {
    uVar1 = (this->outputBuffer_).write_limit_;
    (this->outputBuffer_).write_limit_ = 0xfff;
    if (uVar1 <= (this->outputBuffer_).positions_filled_) {
      SimpleStringBuffer::add
                (this_00,"\netc etc etc etc. !!!! Too many memory leaks to report. Bailing out\n");
      sVar2 = this->total_leaks_;
    }
    SimpleStringBuffer::add(this_00,"%s %d\n","Total number of leaks: ",sVar2);
    if (this->giveWarningOnUsingMalloc_ != true) {
      return;
    }
    format = 
    "NOTE:\n\tMemory leak reports about malloc and free can be caused by allocating using the cpputest version of malloc,\n\tbut deallocate using the standard free.\n\tIf this is the case, check whether your malloc/free replacements are working (#define malloc cpputest_malloc etc).\n"
    ;
  }
  SimpleStringBuffer::add(this_00,format);
  return;
}

Assistant:

void MemoryLeakOutputStringBuffer::stopMemoryLeakReporting()
{
    if (total_leaks_ == 0) {
        addNoMemoryLeaksMessage();
        return;
    }

    bool buffer_reached_its_capacity = outputBuffer_.reachedItsCapacity();
    outputBuffer_.resetWriteLimit();

    if (buffer_reached_its_capacity)
        addErrorMessageForTooMuchLeaks();

    addMemoryLeakFooter(total_leaks_);

    if (giveWarningOnUsingMalloc_)
        addWarningForUsingMalloc();

}